

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp:108:50)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_error_object_cpp:108:50)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  gc_heap *h;
  pointer pvVar1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  gc_heap_ptr<mjs::error_object> eo;
  gc_heap *local_88;
  anon_union_32_5_7b1e0779_for_value_3 local_80;
  gc_heap_ptr_untyped local_60;
  wstring_view local_50;
  gc_heap *local_40;
  uint32_t local_38;
  
  this_00 = &(this->f).global;
  pvVar2 = gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  h = *(gc_heap **)((long)pvVar2 + 8);
  pvVar2 = gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  if (*(long *)((long)pvVar2 + 0x40) != 0) {
    (**(code **)((long)pvVar2 + 0x48))((value *)&local_88,(long)pvVar2 + 0x30);
    local_50._M_len = (size_t)local_80.n_;
    local_50._M_str = (wchar_t *)local_88;
    string::string((string *)&local_60,h,&local_50);
    gc_heap::
    allocate_and_construct<mjs::error_object,mjs::native_error_type_const&,mjs::string_const&,mjs::gc_heap_ptr<mjs::object>const&,mjs::string>
              ((gc_heap *)&stack0xffffffffffffffc0,(size_t)h,(native_error_type *)0x38,
               (string *)&this->f,(gc_heap_ptr<mjs::object> *)&(this->f).n,
               (string *)&(this->f).prototype);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
    if (local_88 != (gc_heap *)((long)&local_80 + 8U)) {
      operator_delete(local_88,CONCAT44(local_80._12_4_,
                                        local_80.s_.super_gc_heap_ptr<mjs::gc_string>.
                                        super_gc_heap_ptr_untyped.pos_) * 4 + 4);
    }
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar1 != (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish) && (pvVar1->type_ != undefined)) {
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
      plVar4 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar4 + 0x98))(&local_60,plVar4,"message");
      to_string((mjs *)&local_50,h,
                (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_start);
      local_88 = (gc_heap *)CONCAT44(local_88._4_4_,string);
      local_80.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)local_50._M_len;
      local_80.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
           (uint32_t)local_50._M_str;
      if ((gc_heap *)local_50._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_50._M_len,(gc_heap_ptr_untyped *)&local_80.s_);
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_60,(value *)&local_88,6);
      value::destroy((value *)&local_88);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_50);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
    }
    local_88 = local_40;
    local_80._0_4_ = local_38;
    if (local_40 == (gc_heap *)0x0) {
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).n_ = 0.0;
      *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_38;
    }
    else {
      gc_heap::attach(local_40,(gc_heap_ptr_untyped *)&local_88);
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = local_88;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_80._0_4_;
      if (local_88 != (gc_heap *)0x0) {
        gc_heap::attach(local_88,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
    return __return_storage_ptr__;
  }
  __assert_fail("stack_trace_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.h"
                ,0x2a,"std::wstring mjs::global_object::stack_trace() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }